

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitThreeArgWithVars_Test::
PrinterTest_EmitThreeArgWithVars_Test(PrinterTest_EmitThreeArgWithVars_Test *this)

{
  PrinterTest_EmitThreeArgWithVars_Test *this_local;
  
  PrinterTest::PrinterTest(&this->super_PrinterTest);
  (this->super_PrinterTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PrinterTest_EmitThreeArgWithVars_Test_02a1c300;
  return;
}

Assistant:

TEST_F(PrinterTest, EmitThreeArgWithVars) {
  FakeAnnotationCollector collector;
  {
    Printer printer(output(), '$', &collector);
    auto v = printer.WithVars({
        Printer::Sub("class", "Foo").AnnotatedAs("file.proto"),
    });

    printer.Emit({{"f1", "x"}, {"f2", "y"}, {"f3", "z"}}, R"cc(
      class $class$ {
        int $f1$, $f2$, $f3$;
      };
    )cc");
  }

  EXPECT_EQ(written(),
            "class Foo {\n"
            "  int x, y, z;\n"
            "};\n");

  EXPECT_THAT(collector.Get(),
              ElementsAre(Annotation(6, 9, "file.proto", IsEmpty())));
}